

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker
          (DateTimePicker *this,QVariant *val,Type parserType,QWidget *parent)

{
  Scroller *pSVar1;
  int iVar2;
  undefined4 uVar3;
  DateTimePickerPrivate *this_00;
  undefined4 *puVar4;
  QDate local_78;
  undefined8 local_70;
  code *local_68;
  ImplFn local_60;
  QTime local_54;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QDate local_38;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001925f8;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_001927a8;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,parserType);
  (this->d).d = this_00;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  local_78.jd = QVariant::metaType();
  if (local_78.jd == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = *(int *)(local_78.jd + 0xc);
    if (iVar2 == 0) {
      iVar2 = QMetaType::idHelper();
    }
  }
  if (iVar2 == 0xe) {
    local_78.jd = QVariant::toDate();
    setDate(this,&local_78);
  }
  else if (iVar2 == 0xf) {
    uVar3 = QVariant::toTime();
    local_78.jd._0_4_ = uVar3;
    setTime(this,(QTime *)&local_78);
  }
  else {
    if (iVar2 == 0x10) {
      QVariant::toDateTime();
      setDateTime(this,(QDateTime *)&local_78);
    }
    else {
      QDate::QDate(&local_38,2000,1,1);
      QTime::QTime(&local_54,0,0,0,0);
      QDateTime::QDateTime((QDateTime *)&local_78,local_38,local_54,LocalTime,0);
      setDateTime(this,(QDateTime *)&local_78);
    }
    QDateTime::~QDateTime((QDateTime *)&local_78);
  }
  pSVar1 = ((this->d).d)->scroller;
  local_78.jd = (qint64)Scroller::aboutToStart;
  local_70 = 0;
  local_68 = _q_scrollAboutToStart;
  local_60 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::DateTimePicker::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar4 + 4) = _q_scrollAboutToStart;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pSVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_68,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pSVar1 = ((this->d).d)->scroller;
  local_78.jd = (qint64)Scroller::scroll;
  local_70 = 0;
  local_68 = _q_scroll;
  local_60 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::DateTimePicker::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = _q_scroll;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pSVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_68,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pSVar1 = ((this->d).d)->scroller;
  local_78.jd = (qint64)Scroller::finished;
  local_70 = 0;
  local_68 = _q_scrollFinished;
  local_60 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::DateTimePicker::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar4 + 4) = _q_scrollFinished;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pSVar1,(QObject *)&local_78,(void **)this,
             (QSlotObjectBase *)&local_68,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QVariant & val, QMetaType::Type parserType,
	QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, parserType ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	switch( val.metaType().id() )
	{
		case QMetaType::QDate :
			setDate( val.toDate() );
			break;

		case QMetaType::QTime :
			setTime( val.toTime() );
			break;

		case QMetaType::QDateTime :
			setDateTime( val.toDateTime() );
			break;

		default :
			setDateTime( QDateTime( DATETIMEPICKER_DATE_INITIAL,
				DATETIMEPICKER_TIME_MIN ) );
	}

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}